

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O3

int ARKodeSetDefaults(void *arkode_mem)

{
  long lVar1;
  int iVar2;
  
  if (arkode_mem == (void *)0x0) {
    iVar2 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0x34,"ARKodeSetDefaults",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
  }
  else {
    if ((*(code **)((long)arkode_mem + 0xe0) != (code *)0x0) &&
       (iVar2 = (**(code **)((long)arkode_mem + 0xe0))(arkode_mem), iVar2 != 0)) {
      return iVar2;
    }
    iVar2 = 0;
    *(undefined4 *)((long)arkode_mem + 0x3d0) = 0;
    *(undefined4 *)((long)arkode_mem + 0x2e0) = 0;
    *(undefined8 *)((long)arkode_mem + 0x18) = 0;
    *(undefined8 *)((long)arkode_mem + 0x20) = 0x3f1a36e2eb1c432d;
    *(undefined8 *)((long)arkode_mem + 0x28) = 0x3e112e0be826d695;
    *(undefined4 *)((long)arkode_mem + 0x38) = 0;
    *(undefined8 *)((long)arkode_mem + 0x40) = 0x3e112e0be826d695;
    *(undefined8 *)((long)arkode_mem + 0x50) = 0;
    *(code **)((long)arkode_mem + 0x58) = arkEwtSetSS;
    *(void **)((long)arkode_mem + 0x60) = arkode_mem;
    *(undefined4 *)((long)arkode_mem + 0x68) = 0;
    *(code **)((long)arkode_mem + 0x70) = arkRwtSet;
    *(void **)((long)arkode_mem + 0x78) = arkode_mem;
    *(undefined8 *)((long)arkode_mem + 0x2f0) = 500;
    *(undefined8 *)((long)arkode_mem + 0x2f8) = 0xa0000000a;
    *(undefined8 *)((long)arkode_mem + 0x300) = 0xa00000007;
    *(undefined8 *)((long)arkode_mem + 0x288) = 0;
    *(undefined8 *)((long)arkode_mem + 0x290) = 0;
    *(undefined8 *)((long)arkode_mem + 0x298) = 0;
    *(undefined8 *)((long)arkode_mem + 0x2a8) = 0;
    *(undefined8 *)((long)arkode_mem + 0x2b0) = 0;
    lVar1 = *(long *)((long)arkode_mem + 0x2e8);
    *(undefined8 *)(lVar1 + 8) = 0x40c3880000000000;
    *(undefined8 *)(lVar1 + 0x10) = 0x3fd3333333333333;
    *(undefined8 *)(lVar1 + 0x18) = 0x3fb999999999999a;
    *(undefined4 *)(lVar1 + 0x20) = 2;
    *(undefined8 *)(lVar1 + 0x28) = 0x3fd0000000000000;
    *(undefined8 *)(lVar1 + 0x30) = 0x3fe0000000000000;
    *(undefined8 *)(lVar1 + 0x38) = 0x3feeb851eb851eb8;
    *(undefined8 *)(lVar1 + 0x40) = 0x4034000000000000;
    *(undefined8 *)(lVar1 + 0x48) = 0x3ff0000000000000;
    *(undefined8 *)(lVar1 + 0x50) = 0x3ff8000000000000;
    *(code **)(lVar1 + 0x78) = arkExpStab;
    *(undefined8 *)(lVar1 + 0x80) = 0;
    *(undefined8 *)(lVar1 + 0x58) = 0;
    *(undefined8 *)(lVar1 + 0x60) = 0xffffffff00000000;
  }
  return iVar2;
}

Assistant:

int ARKodeSetDefaults(void* arkode_mem)
{
  ARKodeMem ark_mem;
  int retval;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Set stepper defaults (if provided) */
  if (ark_mem->step_setdefaults)
  {
    retval = ark_mem->step_setdefaults(arkode_mem);
    if (retval != ARK_SUCCESS) { return retval; }
  }

  /* Set default values for integrator optional inputs */
  ark_mem->use_compensated_sums = SUNFALSE;
  ark_mem->fixedstep            = SUNFALSE; /* default to use adaptive steps */
  ark_mem->reltol               = SUN_RCONST(1.e-4); /* relative tolerance */
  ark_mem->itol      = ARK_SS; /* scalar-scalar solution tolerances */
  ark_mem->ritol     = ARK_SS; /* scalar-scalar residual tolerances */
  ark_mem->Sabstol   = SUN_RCONST(1.e-9); /* solution absolute tolerance */
  ark_mem->atolmin0  = SUNFALSE;          /* min(abstol) > 0 */
  ark_mem->SRabstol  = SUN_RCONST(1.e-9); /* residual absolute tolerance */
  ark_mem->Ratolmin0 = SUNFALSE;          /* min(Rabstol) > 0 */
  ark_mem->user_efun = SUNFALSE;          /* no user-supplied ewt function */
  ark_mem->efun      = arkEwtSetSS;    /* built-in scalar-scalar ewt function */
  ark_mem->e_data    = ark_mem;        /* ewt function data */
  ark_mem->user_rfun = SUNFALSE;       /* no user-supplied rwt function */
  ark_mem->rfun      = arkRwtSet;      /* built-in rwt function */
  ark_mem->r_data    = ark_mem;        /* rwt function data */
  ark_mem->mxstep    = MXSTEP_DEFAULT; /* max number of steps */
  ark_mem->mxhnil    = MXHNIL;         /* max warns of t+h==t */
  ark_mem->maxnef    = MAXNEF;         /* max error test fails */
  ark_mem->maxncf    = MAXNCF;         /* max convergence fails */
  ark_mem->maxconstrfails = MAXCONSTRFAILS; /* max number of constraint fails */
  ark_mem->hin            = ZERO;       /* determine initial step on-the-fly */
  ark_mem->hmin           = ZERO;       /* no minimum step size */
  ark_mem->hmax_inv       = ZERO;       /* no maximum step size */
  ark_mem->tstopset       = SUNFALSE;   /* no stop time set */
  ark_mem->tstopinterp    = SUNFALSE;   /* copy at stop time */
  ark_mem->tstop          = ZERO;       /* no fixed stop time */
  ark_mem->hadapt_mem->etamx1 = ETAMX1; /* max change on first step */
  ark_mem->hadapt_mem->etamxf = ETAMXF; /* max change on error-failed step */
  ark_mem->hadapt_mem->etamin = ETAMIN; /* min bound on time step reduction */
  ark_mem->hadapt_mem->small_nef =
    SMALL_NEF; /* num error fails before ETAMXF enforced */
  ark_mem->hadapt_mem->etacf  = ETACF;  /* max change on convergence failure */
  ark_mem->hadapt_mem->cfl    = CFLFAC; /* explicit stability factor */
  ark_mem->hadapt_mem->safety = SAFETY; /* step adaptivity safety factor  */
  ark_mem->hadapt_mem->growth = GROWTH; /* step adaptivity growth factor */
  ark_mem->hadapt_mem->lbound = HFIXED_LB; /* step adaptivity no-change lower bound */
  ark_mem->hadapt_mem->ubound = HFIXED_UB; /* step adaptivity no-change upper bound */
  ark_mem->hadapt_mem->expstab = arkExpStab; /* internal explicit stability fn */
  ark_mem->hadapt_mem->estab_data = NULL;    /* no explicit stability fn data */
  ark_mem->hadapt_mem->pq         = PQ;      /* embedding order */
  ark_mem->hadapt_mem->p          = 0;       /* no default embedding order */
  ark_mem->hadapt_mem->q          = 0;       /* no default method order */
  ark_mem->hadapt_mem->adjust     = ADJUST;  /* controller order adjustment */
  return (ARK_SUCCESS);
}